

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFFLoader.h
# Opt level: O2

bool __thiscall Assimp::NFFImporter::ShadingInfo::operator==(ShadingInfo *this,ShadingInfo *other)

{
  bool bVar1;
  __type _Var2;
  
  bVar1 = aiColor3D::operator==(&this->color,&other->color);
  if ((((bVar1) && (bVar1 = aiColor3D::operator==(&this->diffuse,&other->diffuse), bVar1)) &&
      (bVar1 = aiColor3D::operator==(&this->specular,&other->specular), bVar1)) &&
     (bVar1 = aiColor3D::operator==(&this->ambient,&other->ambient), bVar1)) {
    if (((this->refracti == other->refracti) && (!NAN(this->refracti) && !NAN(other->refracti))) &&
       ((_Var2 = std::operator==(&this->texFile,&other->texFile), _Var2 &&
        (this->twoSided == other->twoSided)))) {
      return this->shaded == other->shaded;
    }
  }
  return false;
}

Assistant:

bool operator == (const ShadingInfo& other) const
        {
            return color == other.color     &&
                diffuse  == other.diffuse   &&
                specular == other.specular  &&
                ambient  == other.ambient   &&
                refracti == other.refracti  &&
                texFile  == other.texFile   &&
                twoSided == other.twoSided  &&
                shaded   == other.shaded;

            // Some properties from NFF2 aren't compared by this operator.
            // Comparing MeshInfo::matIndex should do that.
        }